

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::addSemaphoreInfo(CLIntercept *this,cl_semaphore_khr semaphore,cl_context context)

{
  cl_platform_id p_Var1;
  mapped_type *pp_Var2;
  long in_RSI;
  key_type *in_RDI;
  map<_cl_semaphore_khr_*,__cl_platform_id_*,_std::less<_cl_semaphore_khr_*>,_std::allocator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>_>
  *unaff_retaddr;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffc0;
  
  if (in_RSI != 0) {
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    p_Var1 = getPlatform((CLIntercept *)semaphore,context);
    pp_Var2 = std::
              map<_cl_semaphore_khr_*,__cl_platform_id_*,_std::less<_cl_semaphore_khr_*>,_std::allocator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>_>
              ::operator[](unaff_retaddr,in_RDI);
    *pp_Var2 = p_Var1;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x209f20);
  }
  return;
}

Assistant:

void CLIntercept::addSemaphoreInfo(
    cl_semaphore_khr semaphore,
    cl_context context )
{
    if( semaphore )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        m_SemaphoreInfoMap[semaphore] = getPlatform(context);
    }
}